

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,cmLocalUnixMakefileGenerator3 *lg)

{
  pointer puVar1;
  pointer puVar2;
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  pointer puVar6;
  string *psVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  pointer puVar11;
  string_view source;
  string_view source_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string localName;
  string tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string makefileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  EchoProgress progress;
  string makeTargetName;
  string name;
  ostringstream progressArg;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&progressArg,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&progress);
  bVar3 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&progressArg);
  std::__cxx11::string::~string((string *)&progressArg);
  if (!bVar3) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  puVar6 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((puVar6->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                        .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    std::__cxx11::string::string((string *)&name,(string *)psVar7);
    if (name._M_string_length != 0) {
      bVar4 = cmGeneratorTarget::IsInBuildSystem
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar4) {
        TVar5 = cmGeneratorTarget::GetType
                          ((puVar6->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar5 != GLOBAL_TARGET) {
          makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
          makefileName._M_string_length = 0;
          makefileName.field_2._M_local_buf[0] = '\0';
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    ((string *)&progressArg,lg,
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmStrCat<std::__cxx11::string&,char_const(&)[12]>
                    ((string *)&progressArg,&localName,(char (*) [12])"/build.make");
          std::__cxx11::string::operator=((string *)&makefileName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
          poVar8 = std::operator<<(ruleFileStream,"# Target rules for target ");
          poVar8 = std::operator<<(poVar8,(string *)&localName);
          std::operator<<(poVar8,"\n\n");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          cmStrCat<std::__cxx11::string&,char_const(&)[8]>
                    ((string *)&progressArg,&localName,(char (*) [8])"/depend");
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmStrCat<std::__cxx11::string&,char_const(&)[7]>
                    ((string *)&progressArg,&localName,(char (*) [7])"/build");
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::string::append((char *)&localName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
          progress.Dir._M_string_length = 0;
          progress.Dir.field_2._M_local_buf[0] = '\0';
          progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
          progress.Arg._M_string_length = 0;
          progress.Arg.field_2._M_local_buf[0] = '\0';
          psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
          cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>
                    ((string *)&progressArg,psVar7,(char (*) [12])"/CMakeFiles");
          std::__cxx11::string::operator=((string *)&progress,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          tmp._M_dataplus._M_p =
               (pointer)(puVar6->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                        .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          pmVar9 = std::
                   map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                   ::operator[](&this->ProgressMap,(key_type *)&tmp);
          puVar2 = (pmVar9->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pcVar10 = "";
          for (puVar11 = (pmVar9->Marks).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1)
          {
            poVar8 = std::operator<<((ostream *)&progressArg,pcVar10);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            pcVar10 = ",";
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&tmp);
          std::__cxx11::string::~string((string *)&tmp);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          this_00 = (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)->
                    State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&progressArg,"TARGET_MESSAGES",(allocator<char> *)&local_260);
          tmp._M_dataplus._M_p = (pointer)cmState::GetGlobalProperty(this_00,(string *)&progressArg)
          ;
          std::__cxx11::string::~string((string *)&progressArg);
          if (tmp._M_dataplus._M_p == (pointer)0x0) {
LAB_00429d7d:
            std::operator+((string *)&progressArg,"Built target ",&name);
            cmLocalUnixMakefileGenerator3::AppendEcho
                      (lg,&commands,(string *)&progressArg,EchoNormal,&progress);
            std::__cxx11::string::~string((string *)&progressArg);
          }
          else {
            bVar4 = cmValue::IsOn((cmValue *)&tmp);
            if (bVar4) goto LAB_00429d7d;
          }
          AppendGlobalTargetDepends
                    (this,&depends,
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"All Build rule for target.",&localName,&depends,
                     &commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          source._M_str = progress.Dir._M_dataplus._M_p;
          source._M_len = progress.Dir._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&tmp,(cmOutputConverter *)lg,source,SHELL,false);
          std::operator<<((ostream *)&progressArg,(string *)&tmp);
          std::__cxx11::string::~string((string *)&tmp);
          tmp._M_string_length._0_4_ = 0;
          tmp.field_2._M_allocated_capacity = 0;
          tmp.field_2._8_8_ = &tmp._M_string_length;
          poVar8 = std::operator<<((ostream *)&progressArg," ");
          CountProgressMarksInTarget
                    (this,(puVar6->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                     (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                      *)&tmp);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     &local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)&tmp);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tmp,"CMakeFiles/Makefile2",(allocator<char> *)&progressArg);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&tmp,&localName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          source_00._M_str = progress.Dir._M_dataplus._M_p;
          source_00._M_len = progress.Dir._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_260,(cmOutputConverter *)lg,source_00,SHELL,false);
          std::operator<<((ostream *)&progressArg,(string *)&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::operator<<((ostream *)&progressArg," 0");
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     &local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          if (!bVar3) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[25]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends
                       ,(char (*) [25])"cmake_check_build_system");
          }
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    (&local_260,lg,
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          cmStrCat<std::__cxx11::string,char_const(&)[6]>
                    ((string *)&progressArg,&local_260,(char (*) [6])"/rule");
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::string::~string((string *)&local_260);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Build rule for subdir invocation for target.",&localName
                     ,&depends,&commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&localName);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Convenience name for target.",&name,&depends,&commands,
                     true,false);
          this_01 = (puVar6->_M_t).
                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                    .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_((string *)&progressArg,lg);
          bVar4 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          if (bVar4) {
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_260,lg,
                       (puVar6->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            cmStrCat<std::__cxx11::string,char_const(&)[12]>
                      ((string *)&progressArg,&local_260,(char (*) [12])"/preinstall");
            std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
            std::__cxx11::string::~string((string *)&progressArg);
            std::__cxx11::string::~string((string *)&local_260);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&depends);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&commands);
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&makefileName,&localName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,(string *)&progressArg);
            std::__cxx11::string::~string((string *)&progressArg);
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"Pre-install relink rule for target.",&localName,
                       &depends,&commands,true,false);
          }
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    ((string *)&progressArg,lg,
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmStrCat<std::__cxx11::string&,char_const(&)[7]>
                    ((string *)&progressArg,&localName,(char (*) [7])"/clean");
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"clean rule for target.",&makeTargetName,&depends,
                     &commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::string::~string((string *)&tmp);
          cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
          std::__cxx11::string::~string((string *)&makefileName);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  cmLocalUnixMakefileGenerator3& lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  for (const auto& gtarget : lg.GetGeneratorTargets()) {
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        (gtarget->IsInBuildSystem() &&
         gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makefileName = cmStrCat(localName, "/build.make");

      lg.WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = cmStrCat(localName, "/depend");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = cmStrCat(localName, "/build");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = cmStrCat(lg.GetBinaryDirectory(), "/CMakeFiles");
      {
        std::ostringstream progressArg;
        const char* sep = "";
        for (unsigned long progFile : this->ProgressMap[gtarget.get()].Marks) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (cmValue tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = tgtMsg.IsOn();
      }

      if (targetMessages) {
        lg.AppendEcho(commands, "Built target " + name,
                      cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget.get());
      rootLG.WriteMakeRule(ruleFileStream, "All Build rule for target.",
                           localName, depends, commands, true);

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " "
                << this->CountProgressMarksInTarget(gtarget.get(), emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/Makefile2";
      commands.push_back(lg.GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName =
        cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()), "/rule");
      rootLG.WriteMakeRule(ruleFileStream,
                           "Build rule for subdir invocation for target.",
                           localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      rootLG.WriteMakeRule(ruleFileStream, "Convenience name for target.",
                           name, depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
        localName = cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()),
                             "/preinstall");
        depends.clear();
        commands.clear();
        commands.push_back(lg.GetRecursiveMakeCall(makefileName, localName));
        rootLG.WriteMakeRule(ruleFileStream,
                             "Pre-install relink rule for target.", localName,
                             depends, commands, true);
      }

      // add the clean rule
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makeTargetName = cmStrCat(localName, "/clean");
      depends.clear();
      commands.clear();
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));
      rootLG.WriteMakeRule(ruleFileStream, "clean rule for target.",
                           makeTargetName, depends, commands, true);
      commands.clear();
    }
  }
}